

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Functional::DepthRangeCompareCase::iterate(DepthRangeCompareCase *this)

{
  float *value;
  float *value_00;
  TestLog *log;
  RenderContext *pRVar1;
  int iVar2;
  bool bVar3;
  deUint32 seed;
  int iVar4;
  int iVar5;
  GLuint index;
  GLenum GVar6;
  undefined4 uVar7;
  undefined4 extraout_var;
  MessageBuilder *pMVar9;
  NotSupportedError *this_00;
  TestError *this_01;
  int iVar10;
  char *description;
  int x;
  int y;
  int iVar11;
  float fVar12;
  float y_00;
  allocator<char> local_326;
  allocator<char> local_325;
  GLint local_324;
  Surface referenceFrame;
  Surface renderedFrame;
  string local_2d8;
  string local_2b8;
  Random rnd;
  undefined1 local_288 [8];
  float local_280;
  undefined8 local_27c;
  int local_274;
  float local_270;
  undefined8 local_26c;
  undefined4 local_264;
  float local_260;
  undefined8 local_25c;
  undefined4 local_254;
  float local_250;
  undefined4 local_24c;
  ShaderProgram program;
  int *piVar8;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  seed = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,seed);
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  piVar8 = (int *)CONCAT44(extraout_var,iVar4);
  iVar4 = *piVar8;
  iVar11 = 0x80;
  if (iVar4 < 0x80) {
    iVar11 = iVar4;
  }
  iVar10 = 0x80;
  if (piVar8[1] < 0x80) {
    iVar10 = piVar8[1];
  }
  iVar4 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar4 - iVar11);
  iVar5 = de::Random::getInt((Random *)&rnd.m_rnd,0,piVar8[1] - iVar10);
  tcu::Surface::Surface(&renderedFrame,iVar11,iVar10);
  tcu::Surface::Surface(&referenceFrame,iVar11,iVar10);
  if (piVar8[6] != 0) {
    pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,
               "attribute highp vec4 a_position;\nattribute highp vec2 a_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
               ,&local_325);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,
               "uniform mediump vec4 u_color;\nvoid main (void)\n{\n\tgl_FragColor = u_color;\n}\n",
               &local_326);
    glu::makeVtxFragSources((ProgramSources *)local_288,&local_2b8,&local_2d8);
    glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)local_288);
    glu::ProgramSources::~ProgramSources((ProgramSources *)local_288);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2b8);
    if (program.m_program.m_info.linkOk != false) {
      local_324 = glwGetUniformLocation(program.m_program.m_program,"u_color");
      index = glwGetAttribLocation(program.m_program.m_program,"a_position");
      local_288 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_280);
      std::operator<<((ostream *)&local_280,"glDepthRangef(");
      value = &this->m_zNear;
      pMVar9 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_288,value);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      value_00 = &this->m_zFar;
      pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,value_00);
      std::operator<<(&(pMVar9->m_str).super_basic_ostream<char,_std::char_traits<char>_>,")");
      tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_280);
      glwViewport(iVar4,iVar5,iVar11,iVar10);
      glwClear(0x4500);
      glwEnable(0xb71);
      glwUseProgram(program.m_program.m_program);
      glwEnableVertexAttribArray(index);
      glwUniform4f(local_324,0.0,0.0,1.0,1.0);
      glwDepthFunc(0x207);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,iterate::constDepthCoord);
      glwDrawElements(4,6,0x1403,iterate::quadIndices);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,iterate::varyingDepthCoord);
      glwDrawElements(4,6,0x1403,iterate::quadIndices);
      GVar6 = glwGetError();
      glu::checkError(GVar6,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                      ,0xcb);
      local_288._0_4_ = 0xbf800000;
      local_288._4_4_ = 0xbf800000;
      local_280 = (this->m_depthCoord).m_data[0];
      local_27c = 0xbf8000003f800000;
      local_274 = 0x3f800000;
      local_270 = (this->m_depthCoord).m_data[1];
      local_26c = 0x3f8000003f800000;
      local_264 = 0xbf800000;
      local_260 = (this->m_depthCoord).m_data[2];
      local_25c = 0x3f8000003f800000;
      local_254 = 0x3f800000;
      local_250 = (this->m_depthCoord).m_data[3];
      local_24c = 0x3f800000;
      glwDepthRangef(this->m_zNear,this->m_zFar);
      glwDepthFunc(this->m_compareFunc);
      glwUniform4f(local_324,0.0,1.0,0.0,1.0);
      glwVertexAttribPointer(index,4,0x1406,'\0',0,local_288);
      glwDrawElements(4,6,0x1403,iterate::quadIndices);
      GVar6 = glwGetError();
      glu::checkError(GVar6,(char *)0x0,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
                      ,0xdf);
      pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess((PixelBufferAccess *)local_288,&renderedFrame);
      glu::readPixels(pRVar1,iVar4,iVar5,(PixelBufferAccess *)local_288);
      for (iVar4 = 0; iVar4 < referenceFrame.m_height; iVar4 = iVar4 + 1) {
        iVar10 = (int)((float)referenceFrame.m_width * 0.5 + 0.5);
        y_00 = ((float)iVar4 + 0.5) / (float)referenceFrame.m_height;
        iVar11 = referenceFrame.m_width;
        if (iVar10 < referenceFrame.m_width) {
          iVar11 = iVar10;
        }
        if (iVar10 < 0) {
          iVar11 = 0;
        }
        iVar10 = 0;
        iVar5 = 0;
        if (0 < iVar11) {
          iVar10 = 0;
          iVar5 = iVar11;
        }
        for (; iVar5 != iVar10; iVar10 = iVar10 + 1) {
          fVar12 = triQuadInterpolate(((float)iVar10 + 0.5) / (float)referenceFrame.m_width,y_00,
                                      &this->m_depthCoord);
          fVar12 = depthRangeTransform(fVar12,*value,*value_00);
          bVar3 = compare<float>(this->m_compareFunc,fVar12,0.55);
          uVar7 = 0xffff0000;
          if (bVar3) {
            uVar7 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)referenceFrame.m_pixels.m_ptr +
           (long)(referenceFrame.m_width * iVar4 + iVar10) * 4) = uVar7;
        }
        iVar5 = 0;
        for (iVar10 = iVar11; iVar2 = referenceFrame.m_width, iVar10 < referenceFrame.m_width;
            iVar10 = iVar10 + 1) {
          fVar12 = triQuadInterpolate(((float)iVar10 + 0.5) / (float)referenceFrame.m_width,y_00,
                                      &this->m_depthCoord);
          fVar12 = depthRangeTransform(fVar12,*value,*value_00);
          bVar3 = compare<float>(this->m_compareFunc,fVar12,
                                 1.0 - (((float)iVar5 + 0.5) / (float)(iVar2 - iVar11) + y_00) * 0.5
                                );
          uVar7 = 0xffff0000;
          if (bVar3) {
            uVar7 = 0xff00ff00;
          }
          *(undefined4 *)
           ((long)referenceFrame.m_pixels.m_ptr +
           (long)(referenceFrame.m_width * iVar4 + iVar10) * 4) = uVar7;
          iVar5 = iVar5 + 1;
        }
      }
      bVar3 = tcu::fuzzyCompare(log,"Result","Image comparison result",&referenceFrame,
                                &renderedFrame,0.05,COMPARE_LOG_RESULT);
      description = "Fail";
      if (bVar3) {
        description = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar3,
                 description);
      glu::ShaderProgram::~ShaderProgram(&program);
      tcu::Surface::~Surface(&referenceFrame);
      tcu::Surface::~Surface(&renderedFrame);
      return STOP;
    }
    glu::operator<<(log,&program);
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
               ,0xa1);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Depth buffer is required",glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fDepthRangeTests.cpp"
             ,0x9a);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

DepthRangeCompareCase::IterateResult DepthRangeCompareCase::iterate (void)
{
	TestLog&					log					= m_testCtx.getLog();
	de::Random					rnd					(deStringHash(getName()));
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderContext().getRenderTarget();
	const int					viewportW			= de::min(128, renderTarget.getWidth());
	const int					viewportH			= de::min(128, renderTarget.getHeight());
	const int					viewportX			= rnd.getInt(0, renderTarget.getWidth()-viewportW);
	const int					viewportY			= rnd.getInt(0, renderTarget.getHeight()-viewportH);
	tcu::Surface				renderedFrame		(viewportW, viewportH);
	tcu::Surface				referenceFrame		(viewportW, viewportH);
	const float					constDepth			= 0.1f;

	if (renderTarget.getDepthBits() == 0)
		throw tcu::NotSupportedError("Depth buffer is required", "", __FILE__, __LINE__);

	const glu::ShaderProgram	program				(m_context.getRenderContext(), glu::makeVtxFragSources(s_vertexShaderSrc, s_fragmentShaderSrc));

	if (!program.isOk())
	{
		log << program;
		TCU_FAIL("Compile failed");
	}

	const int					colorLoc			= glGetUniformLocation(program.getProgram(), "u_color");
	const int					posLoc				= glGetAttribLocation(program.getProgram(), "a_position");

	m_testCtx.getLog() << TestLog::Message << "glDepthRangef(" << m_zNear << ", " << m_zFar << ")" << TestLog::EndMessage;

	glViewport(viewportX, viewportY, viewportW, viewportH);
	glClear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	glEnable(GL_DEPTH_TEST);
	glUseProgram(program.getProgram());
	glEnableVertexAttribArray(posLoc);

	static const deUint16 quadIndices[] = { 0, 1, 2, 2, 1, 3 };

	// Fill viewport with 2 quads - one with constant depth and another with d = [-1..1]
	{
		static const float constDepthCoord[] =
		{
			-1.0f, -1.0f, constDepth, 1.0f,
			-1.0f, +1.0f, constDepth, 1.0f,
			 0.0f, -1.0f, constDepth, 1.0f,
			 0.0f, +1.0f, constDepth, 1.0f
		};
		static const float varyingDepthCoord[] =
		{
			 0.0f, -1.0f, +1.0f, 1.0f,
			 0.0f, +1.0f,  0.0f, 1.0f,
			+1.0f, -1.0f,  0.0f, 1.0f,
			+1.0f, +1.0f, -1.0f, 1.0f
		};

		glUniform4f(colorLoc, 0.0f, 0.0f, 1.0f, 1.0f);
		glDepthFunc(GL_ALWAYS);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &constDepthCoord);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &varyingDepthCoord);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		GLU_CHECK();
	}

	// Render with depth test.
	{
		const float position[] =
		{
			-1.0f, -1.0f, m_depthCoord[0], 1.0f,
			-1.0f, +1.0f, m_depthCoord[1], 1.0f,
			+1.0f, -1.0f, m_depthCoord[2], 1.0f,
			+1.0f, +1.0f, m_depthCoord[3], 1.0f
		};

		glDepthRangef(m_zNear, m_zFar);
		glDepthFunc(m_compareFunc);
		glUniform4f(colorLoc, 0.0f, 1.0f, 0.0f, 1.0f);

		glVertexAttribPointer(posLoc, 4, GL_FLOAT, GL_FALSE, 0, &position[0]);
		glDrawElements(GL_TRIANGLES, DE_LENGTH_OF_ARRAY(quadIndices), GL_UNSIGNED_SHORT, &quadIndices[0]);

		GLU_CHECK();
	}

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedFrame.getAccess());

	// Render reference.
	for (int y = 0; y < referenceFrame.getHeight(); y++)
	{
		float	yf		= ((float)y + 0.5f) / (float)referenceFrame.getHeight();
		int		half	= de::clamp((int)((float)referenceFrame.getWidth()*0.5f + 0.5f), 0, referenceFrame.getWidth());

		// Fill left half - comparison to constant 0.5
		for (int x = 0; x < half; x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			bool	dpass	= compare(m_compareFunc, d, constDepth*0.5f + 0.5f);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}

		// Fill right half - comparison to interpolated depth
		for (int x = half; x < referenceFrame.getWidth(); x++)
		{
			float	xf		= ((float)x + 0.5f) / (float)referenceFrame.getWidth();
			float	xh		= ((float)(x - half) + 0.5f) / (float)(referenceFrame.getWidth()-half);
			float	rd		= 1.0f - (xh + yf) * 0.5f;
			float	d		= depthRangeTransform(triQuadInterpolate(xf, yf, m_depthCoord), m_zNear, m_zFar);
			bool	dpass	= compare(m_compareFunc, d, rd);

			referenceFrame.setPixel(x, y, dpass ? tcu::RGBA::green() : tcu::RGBA::blue());
		}
	}

	bool isOk = tcu::fuzzyCompare(log, "Result", "Image comparison result", referenceFrame, renderedFrame, 0.05f, tcu::COMPARE_LOG_RESULT);
	m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
							isOk ? "Pass"				: "Fail");
	return STOP;
}